

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O2

void __thiscall Fl_RGB_Image::color_average(Fl_RGB_Image *this,Fl_Color c,float i)

{
  byte *pbVar1;
  undefined4 in_EAX;
  uchar *puVar2;
  byte *pbVar3;
  int iVar4;
  uchar *puVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  float fVar10;
  uchar b;
  uchar g;
  uchar r;
  undefined4 uStack_28;
  float local_24;
  
  if (((((this->super_Fl_Image).w_ != 0) && ((this->super_Fl_Image).h_ != 0)) &&
      ((this->super_Fl_Image).d_ != 0)) && (this->array != (uchar *)0x0)) {
    _uStack_28 = CONCAT44(i,in_EAX);
    (*(this->super_Fl_Image)._vptr_Fl_Image[8])(this);
    if (this->alloc_array == 0) {
      puVar2 = (uchar *)operator_new__((long)(this->super_Fl_Image).d_ *
                                       (long)(this->super_Fl_Image).w_ *
                                       (long)(this->super_Fl_Image).h_);
    }
    else {
      puVar2 = this->array;
    }
    Fl::get_color(c,(uchar *)((long)&uStack_28 + 3),(uchar *)((long)&uStack_28 + 2),
                  (uchar *)((long)&uStack_28 + 1));
    fVar10 = 0.0;
    if ((0.0 <= local_24) && (fVar10 = local_24, 1.0 < local_24)) {
      fVar10 = 1.0;
    }
    iVar4 = (this->super_Fl_Image).ld_;
    if (iVar4 == 0) {
      iVar8 = (this->super_Fl_Image).d_;
      lVar6 = 0;
    }
    else {
      iVar8 = (this->super_Fl_Image).d_;
      lVar6 = (long)(iVar4 - (this->super_Fl_Image).w_ * iVar8);
    }
    iVar4 = (int)(long)(fVar10 * 256.0);
    iVar7 = 0x100 - iVar4;
    if (iVar8 < 3) {
      pbVar3 = this->array;
      puVar5 = puVar2;
      for (iVar8 = 0; iVar8 < (this->super_Fl_Image).h_; iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < (this->super_Fl_Image).w_; iVar9 = iVar9 + 1) {
          *puVar5 = (uchar)((uint)*pbVar3 * iVar4 +
                            iVar7 * (((uint)uStack_28._2_1_ * 0x3d + (uint)uStack_28._3_1_ * 0x1f +
                                     (uint)uStack_28._1_1_ * 8) / 100) >> 8);
          if ((this->super_Fl_Image).d_ < 2) {
            pbVar3 = pbVar3 + 1;
            puVar5 = puVar5 + 1;
          }
          else {
            pbVar1 = pbVar3 + 1;
            pbVar3 = pbVar3 + 2;
            puVar5[1] = *pbVar1;
            puVar5 = puVar5 + 2;
          }
        }
        pbVar3 = pbVar3 + lVar6;
      }
    }
    else {
      pbVar3 = this->array;
      puVar5 = puVar2;
      for (iVar8 = 0; iVar8 < (this->super_Fl_Image).h_; iVar8 = iVar8 + 1) {
        for (iVar9 = 0; iVar9 < (this->super_Fl_Image).w_; iVar9 = iVar9 + 1) {
          *puVar5 = (uchar)((uint)*pbVar3 * iVar4 + (uint)uStack_28._3_1_ * iVar7 >> 8);
          puVar5[1] = (uchar)((uint)pbVar3[1] * iVar4 + (uint)uStack_28._2_1_ * iVar7 >> 8);
          puVar5[2] = (uchar)((uint)pbVar3[2] * iVar4 + (uint)uStack_28._1_1_ * iVar7 >> 8);
          if ((this->super_Fl_Image).d_ < 4) {
            pbVar3 = pbVar3 + 3;
            puVar5 = puVar5 + 3;
          }
          else {
            pbVar1 = pbVar3 + 3;
            pbVar3 = pbVar3 + 4;
            puVar5[3] = *pbVar1;
            puVar5 = puVar5 + 4;
          }
        }
        pbVar3 = pbVar3 + lVar6;
      }
    }
    if (this->alloc_array == 0) {
      this->array = puVar2;
      this->alloc_array = 1;
      (this->super_Fl_Image).ld_ = 0;
    }
  }
  return;
}

Assistant:

void Fl_RGB_Image::color_average(Fl_Color c, float i) {
  // Don't average an empty image...
  if (!w() || !h() || !d() || !array) return;

  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  uchar		*new_array,
		*new_ptr;

  if (!alloc_array) new_array = new uchar[h() * w() * d()];
  else new_array = (uchar *)array;

  // Get the color to blend with...
  uchar		r, g, b;
  unsigned	ia, ir, ig, ib;

  Fl::get_color(c, r, g, b);
  if (i < 0.0f) i = 0.0f;
  else if (i > 1.0f) i = 1.0f;

  ia = (unsigned)(256 * i);
  ir = r * (256 - ia);
  ig = g * (256 - ia);
  ib = b * (256 - ia);

  // Update the image data to do the blend...
  const uchar	*old_ptr;
  int		x, y;
  int   line_i = ld() ? ld() - (w()*d()) : 0; // increment from line end to beginning of next line

  if (d() < 3) {
    ig = (r * 31 + g * 61 + b * 8) / 100 * (256 - ia);

    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	if (d() > 1) *new_ptr++ = *old_ptr++;
      }
  } else {
    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ir) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ib) >> 8;
	if (d() > 3) *new_ptr++ = *old_ptr++;
      }
  }

  // Set the new pointers/values as needed...
  if (!alloc_array) {
    array       = new_array;
    alloc_array = 1;

    ld(0);
  }
}